

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O2

void mbedtls_ct_memmove_left(void *start,size_t total,size_t offset)

{
  byte *pbVar1;
  byte bVar2;
  mbedtls_ct_condition_t mVar3;
  size_t sVar4;
  size_t i;
  mbedtls_ct_uint_t x;
  
  for (x = 0; x != total; x = x + 1) {
    mVar3 = mbedtls_ct_uint_lt(x,total - offset);
    for (sVar4 = 1; bVar2 = (byte)mVar3, total != sVar4; sVar4 = sVar4 + 1) {
      *(byte *)((long)start + (sVar4 - 1)) =
           *(byte *)((long)start + sVar4) & ~((byte)mbedtls_ct_zero ^ bVar2) |
           *(byte *)((long)start + (sVar4 - 1)) & bVar2;
    }
    pbVar1 = (byte *)((long)start + (total - 1));
    *pbVar1 = *pbVar1 & bVar2;
  }
  return;
}

Assistant:

void mbedtls_ct_memmove_left(void *start, size_t total, size_t offset)
{
    volatile unsigned char *buf = (unsigned char *) start;
    for (size_t i = 0; i < total; i++) {
        mbedtls_ct_condition_t no_op = mbedtls_ct_uint_gt(total - offset, i);
        /* The first `total - offset` passes are a no-op. The last
         * `offset` passes shift the data one byte to the left and
         * zero out the last byte. */
        for (size_t n = 0; n < total - 1; n++) {
            unsigned char current = buf[n];
            unsigned char next    = buf[n+1];
            buf[n] = mbedtls_ct_uint_if(no_op, current, next);
        }
        buf[total-1] = mbedtls_ct_uint_if_else_0(no_op, buf[total-1]);
    }
}